

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regexcmp.cpp
# Opt level: O1

UnicodeSet * __thiscall
icu_63::RegexCompile::createSetForProperty(RegexCompile *this,UnicodeString *propName,UBool negated)

{
  short sVar1;
  undefined8 uVar2;
  int8_t iVar3;
  UBool UVar4;
  undefined4 uVar5;
  int iVar6;
  int32_t iVar7;
  UnicodeSet *pUVar8;
  UnicodeSet *pUVar9;
  UChar32 end;
  char16_t *pcVar10;
  size_t sVar11;
  uint options;
  UErrorCode status;
  LocalPointer<icu_63::UnicodeSet> set;
  UnicodeString mPropName;
  UnicodeString setExpr;
  UnicodeString blockName;
  undefined1 local_3dc [20];
  UnicodeMatcher local_3c8;
  ConstChar16Ptr local_3c0;
  ConstChar16Ptr local_3b8;
  ConstChar16Ptr local_3b0;
  ConstChar16Ptr local_3a8;
  ConstChar16Ptr local_3a0;
  ConstChar16Ptr local_398;
  ConstChar16Ptr local_390;
  ConstChar16Ptr local_388;
  ConstChar16Ptr local_380;
  ConstChar16Ptr local_378;
  ConstChar16Ptr local_370;
  ConstChar16Ptr local_368;
  ConstChar16Ptr local_360;
  ConstChar16Ptr local_358;
  ConstChar16Ptr local_350;
  ConstChar16Ptr local_348;
  ConstChar16Ptr local_340;
  ConstChar16Ptr local_338;
  UnicodeString local_330;
  char16_t *local_2f0;
  char16_t *local_2e0;
  char16_t *local_2d0;
  char16_t *local_2c0;
  char16_t *local_2b0;
  _func_int **local_2a0;
  char16_t *local_290;
  char16_t *local_280;
  char16_t *local_270;
  char16_t *local_260;
  char16_t *local_250;
  char16_t *local_240;
  char16_t *local_230;
  char16_t *local_220;
  char16_t *local_210;
  char16_t *local_200;
  char16_t *local_1f0;
  char16_t *local_1e0;
  char16_t *local_1d0;
  char16_t *local_1c0;
  char16_t *local_1b0;
  char16_t *local_1a0;
  char16_t *local_190;
  char16_t *local_180;
  char16_t *local_178;
  char16_t *local_170;
  char16_t *local_160;
  char16_t *local_158;
  char16_t *local_148;
  char16_t *local_138;
  char16_t *local_128;
  char16_t *local_118;
  UnicodeString local_108;
  UnicodeSet local_c8;
  UnicodeString local_70;
  
  if (U_ZERO_ERROR < *this->fStatus) {
    return (UnicodeSet *)0x0;
  }
  local_3dc._4_8_ = (UnicodeSet *)0x0;
  local_3dc._0_4_ = U_ZERO_ERROR;
  local_108.super_Replaceable.super_UObject._vptr_UObject = (UObject)&PTR__UnicodeString_00252160;
  local_108.fUnion.fStackFields.fLengthAndFlags = 2;
  UnicodeString::doAppend(&local_108,L"[\\p{",0,-1);
  local_118 = L"[\\p{";
  sVar1 = (propName->fUnion).fStackFields.fLengthAndFlags;
  if (sVar1 < 0) {
    iVar7 = (propName->fUnion).fFields.fLength;
  }
  else {
    iVar7 = (int)sVar1 >> 5;
  }
  UnicodeString::doAppend(&local_108,propName,0,iVar7);
  pcVar10 = L"}]";
  UnicodeString::doAppend(&local_108,L"}]",0,-1);
  local_128 = L"}]";
  options = this->fModeFlags & 2;
  pUVar8 = (UnicodeSet *)UMemory::operator_new((UMemory *)0x58,(size_t)pcVar10);
  if (pUVar8 == (UnicodeSet *)0x0) {
    pUVar8 = (UnicodeSet *)0x0;
  }
  else {
    UnicodeSet::UnicodeSet(pUVar8,&local_108,options,(SymbolTable *)0x0,(UErrorCode *)local_3dc);
  }
  LocalPointer<icu_63::UnicodeSet>::adoptInsteadAndCheckErrorCode
            ((LocalPointer<icu_63::UnicodeSet> *)(local_3dc + 4),pUVar8,(UErrorCode *)local_3dc);
  if (local_3dc._0_4_ == U_MEMORY_ALLOCATION_ERROR ||
      (int)local_3dc._0_4_ < U_ILLEGAL_ARGUMENT_ERROR) goto LAB_0016e8a6;
  local_3dc._0_4_ = U_ZERO_ERROR;
  sVar1 = (propName->fUnion).fStackFields.fLengthAndFlags;
  if (sVar1 < 0) {
    iVar7 = (propName->fUnion).fFields.fLength;
  }
  else {
    iVar7 = (int)sVar1 >> 5;
  }
  sVar11 = 0;
  iVar3 = UnicodeString::doCaseCompare(propName,0,iVar7,L"word",0,-1,0);
  local_138 = L"word";
  if (iVar3 == '\0') {
    pUVar8 = (UnicodeSet *)UMemory::operator_new((UMemory *)0x58,sVar11);
    if (pUVar8 == (UnicodeSet *)0x0) {
LAB_0016deab:
      pUVar8 = (UnicodeSet *)0x0;
    }
    else {
      UnicodeSet::UnicodeSet(pUVar8,this->fRXPat->fStaticSets[1]);
    }
  }
  else {
    sVar1 = (propName->fUnion).fStackFields.fLengthAndFlags;
    if (sVar1 < 0) {
      iVar7 = (propName->fUnion).fFields.fLength;
    }
    else {
      iVar7 = (int)sVar1 >> 5;
    }
    sVar11 = 0;
    iVar3 = UnicodeString::doCompare(propName,0,iVar7,L"all",0,-1);
    local_148 = L"all";
    if (iVar3 != '\0') {
      UnicodeString::UnicodeString(&local_330,propName);
      sVar11 = 0;
      iVar3 = UnicodeString::doCompare(&local_330,0,2,L"In",0,2);
      if (iVar3 == '\0') {
        uVar5 = local_330.fUnion.fFields.fLength;
        if (-1 < local_330.fUnion.fStackFields.fLengthAndFlags) {
          uVar5 = (int)local_330.fUnion.fStackFields.fLengthAndFlags >> 5;
        }
        local_160 = L"In";
        if ((int)uVar5 < 3) goto LAB_0016df16;
        local_3dc._0_4_ = U_ZERO_ERROR;
        pUVar8 = (UnicodeSet *)UMemory::operator_new((UMemory *)0x58,sVar11);
        if (pUVar8 == (UnicodeSet *)0x0) {
          pUVar8 = (UnicodeSet *)0x0;
        }
        else {
          UnicodeSet::UnicodeSet(pUVar8);
        }
        LocalPointer<icu_63::UnicodeSet>::adoptInsteadAndCheckErrorCode
                  ((LocalPointer<icu_63::UnicodeSet> *)(local_3dc + 4),pUVar8,
                   (UErrorCode *)local_3dc);
        if ((int)local_3dc._0_4_ < U_ILLEGAL_ARGUMENT_ERROR) {
          UnicodeString::UnicodeString((UnicodeString *)&local_c8,&local_330,2);
          uVar2 = local_3dc._4_8_;
          UnicodeString::UnicodeString(&local_70,L"Block");
          pUVar8 = (UnicodeSet *)&local_70;
          UnicodeSet::applyPropertyAlias
                    ((UnicodeSet *)uVar2,(UnicodeString *)pUVar8,(UnicodeString *)&local_c8,
                     (UErrorCode *)local_3dc);
          UnicodeString::~UnicodeString(&local_70);
          UnicodeString::~UnicodeString((UnicodeString *)&local_c8);
        }
      }
      else {
        local_158 = L"In";
LAB_0016df16:
        iVar3 = UnicodeString::doCompare(propName,0,2,L"Is",0,2);
        if (iVar3 == '\0') {
          sVar1 = (propName->fUnion).fStackFields.fLengthAndFlags;
          if (sVar1 < 0) {
            iVar6 = (propName->fUnion).fFields.fLength;
          }
          else {
            iVar6 = (int)sVar1 >> 5;
          }
          local_178 = L"Is";
          if (iVar6 < 3) goto LAB_0016df9f;
          UnicodeString::doReplace(&local_330,0,2,(UChar *)0x0,0,0);
          if (-1 < local_330.fUnion.fStackFields.fLengthAndFlags) {
            local_330.fUnion.fFields.fLength =
                 (int)local_330.fUnion.fStackFields.fLengthAndFlags >> 5;
          }
          pUVar8 = (UnicodeSet *)0x3d;
          iVar7 = UnicodeString::doIndexOf(&local_330,L'=',0,local_330.fUnion.fFields.fLength);
          if (iVar7 < 0) {
            local_338.p_ = L"assigned";
            iVar3 = UnicodeString::caseCompare(&local_330,&local_338,-1,0);
            local_2c0 = local_338.p_;
            if (iVar3 == '\0') {
              UnicodeString::setTo(&local_330,L"unassigned",-1);
              negated = negated == '\0';
            }
            else {
              local_340.p_ = L"TitleCase";
              iVar3 = UnicodeString::caseCompare(&local_330,&local_340,-1,0);
              local_2d0 = local_340.p_;
              if (iVar3 == '\0') {
                UnicodeString::setTo(&local_330,L"Titlecase_Letter",-1);
              }
            }
            UnicodeString::doReplace(&local_330,0,0,L"[\\p{",0,-1);
            local_2e0 = L"[\\p{";
            pcVar10 = L"}]";
            UnicodeString::doAppend(&local_330,L"}]",0,-1);
            local_2f0 = L"}]";
            pUVar8 = (UnicodeSet *)UMemory::operator_new((UMemory *)0x58,(size_t)pcVar10);
            if (pUVar8 == (UnicodeSet *)0x0) {
              pUVar8 = (UnicodeSet *)0x0;
            }
            else {
              UnicodeSet::UnicodeSet(pUVar8,&local_330,this->fStatus);
            }
            LocalPointer<icu_63::UnicodeSet>::adoptInsteadAndCheckErrorCode
                      ((LocalPointer<icu_63::UnicodeSet> *)(local_3dc + 4),pUVar8,
                       (UErrorCode *)local_3dc);
            if (((int)local_3dc._0_4_ < U_ILLEGAL_ARGUMENT_ERROR) &&
               (UVar4 = UnicodeSet::isEmpty((UnicodeSet *)local_3dc._4_8_),
               UVar4 == '\0' && options != 0)) {
              pUVar8 = (UnicodeSet *)0x2;
              UnicodeSet::closeOver((UnicodeSet *)local_3dc._4_8_,2);
            }
            goto LAB_0016e899;
          }
        }
        else {
          local_170 = L"Is";
LAB_0016df9f:
          local_180 = L"java";
          iVar7 = u_strlen_63(L"java");
          pUVar8 = (UnicodeSet *)0x0;
          iVar3 = UnicodeString::doCompare(propName,0,iVar7,L"java",0,iVar7);
          local_190 = L"java";
          if (iVar3 == '\0') {
            local_3dc._0_4_ = U_ZERO_ERROR;
            pUVar8 = (UnicodeSet *)UMemory::operator_new((UMemory *)0x58,(size_t)pUVar8);
            if (pUVar8 == (UnicodeSet *)0x0) {
              pUVar8 = (UnicodeSet *)0x0;
            }
            else {
              UnicodeSet::UnicodeSet(pUVar8);
            }
            LocalPointer<icu_63::UnicodeSet>::adoptInsteadAndCheckErrorCode
                      ((LocalPointer<icu_63::UnicodeSet> *)(local_3dc + 4),pUVar8,
                       (UErrorCode *)local_3dc);
            if (U_ZERO_ERROR < (int)local_3dc._0_4_) goto LAB_0016e899;
            local_348.p_ = L"javaDefined";
            iVar3 = UnicodeString::compare(propName,&local_348,-1);
            local_1a0 = local_348.p_;
            if (iVar3 == '\0') {
              pUVar8 = (UnicodeSet *)0x1;
              addCategory((UnicodeSet *)local_3dc._4_8_,1,(UErrorCode *)local_3dc);
              UnicodeSet::complement((UnicodeSet *)local_3dc._4_8_);
              goto LAB_0016e86a;
            }
            local_350.p_ = L"javaDigit";
            iVar3 = UnicodeString::compare(propName,&local_350,-1);
            local_1b0 = local_350.p_;
            pUVar8 = (UnicodeSet *)0x200;
            if (iVar3 == '\0') {
LAB_0016e858:
              addCategory((UnicodeSet *)local_3dc._4_8_,(int32_t)pUVar8,(UErrorCode *)local_3dc);
            }
            else {
              local_358.p_ = L"javaIdentifierIgnorable";
              iVar3 = UnicodeString::compare(propName,&local_358,-1);
              local_1c0 = local_358.p_;
              if (iVar3 != '\0') {
                local_360.p_ = L"javaISOControl";
                iVar3 = UnicodeString::compare(propName,&local_360,-1);
                local_1d0 = local_360.p_;
                if (iVar3 == '\0') {
                  pUVar9 = UnicodeSet::add((UnicodeSet *)local_3dc._4_8_,0,0x1f);
                  end = 0x9f;
                  pUVar8 = (UnicodeSet *)0x7f;
LAB_0016e64e:
                  UnicodeSet::add(pUVar9,(UChar32)pUVar8,end);
                  goto LAB_0016e86a;
                }
                local_368.p_ = L"javaJavaIdentifierPart";
                iVar3 = UnicodeString::compare(propName,&local_368,-1);
                local_1e0 = local_368.p_;
                if (iVar3 != '\0') {
                  local_370.p_ = L"javaJavaIdentifierStart";
                  iVar3 = UnicodeString::compare(propName,&local_370,-1);
                  local_1f0 = local_370.p_;
                  if (iVar3 == '\0') {
                    addCategory((UnicodeSet *)local_3dc._4_8_,0x3e,(UErrorCode *)local_3dc);
                    addCategory((UnicodeSet *)local_3dc._4_8_,0x400,(UErrorCode *)local_3dc);
                    pUVar8 = (UnicodeSet *)0x400000;
                    addCategory((UnicodeSet *)local_3dc._4_8_,0x2000000,(UErrorCode *)local_3dc);
                  }
                  else {
                    local_378.p_ = L"javaLetter";
                    iVar3 = UnicodeString::compare(propName,&local_378,-1);
                    local_200 = local_378.p_;
                    if (iVar3 == '\0') {
                      pUVar8 = (UnicodeSet *)0x3e;
                    }
                    else {
                      local_380.p_ = L"javaLetterOrDigit";
                      iVar3 = UnicodeString::compare(propName,&local_380,-1);
                      local_210 = local_380.p_;
                      if (iVar3 == '\0') {
                        addCategory((UnicodeSet *)local_3dc._4_8_,0x3e,(UErrorCode *)local_3dc);
                      }
                      else {
                        local_388.p_ = L"javaLowerCase";
                        iVar3 = UnicodeString::compare(propName,&local_388,-1);
                        local_220 = local_388.p_;
                        if (iVar3 == '\0') {
                          pUVar8 = (UnicodeSet *)0x4;
                        }
                        else {
                          local_390.p_ = L"javaMirrored";
                          iVar3 = UnicodeString::compare(propName,&local_390,-1);
                          local_230 = local_390.p_;
                          if (iVar3 == '\0') {
                            pUVar8 = (UnicodeSet *)0x3;
                            UnicodeSet::applyIntPropertyValue
                                      ((UnicodeSet *)local_3dc._4_8_,UCHAR_BIDI_MIRRORED,1,
                                       (UErrorCode *)local_3dc);
                            goto LAB_0016e86a;
                          }
                          local_398.p_ = L"javaSpaceChar";
                          iVar3 = UnicodeString::compare(propName,&local_398,-1);
                          local_240 = local_398.p_;
                          if (iVar3 == '\0') {
                            pUVar8 = (UnicodeSet *)0x7000;
                          }
                          else {
                            local_3a0.p_ = L"javaSupplementaryCodePoint";
                            iVar3 = UnicodeString::compare(propName,&local_3a0,-1);
                            local_250 = local_3a0.p_;
                            if (iVar3 == '\0') {
                              pUVar8 = (UnicodeSet *)0x10000;
LAB_0016e7a1:
                              end = 0x10ffff;
                              pUVar9 = (UnicodeSet *)local_3dc._4_8_;
                              goto LAB_0016e64e;
                            }
                            local_3a8.p_ = L"javaTitleCase";
                            iVar3 = UnicodeString::compare(propName,&local_3a8,-1);
                            local_260 = local_3a8.p_;
                            if (iVar3 == '\0') {
                              pUVar8 = (UnicodeSet *)0x8;
                            }
                            else {
                              local_3b0.p_ = L"javaUnicodeIdentifierStart";
                              iVar3 = UnicodeString::compare(propName,&local_3b0,-1);
                              local_270 = local_3b0.p_;
                              if (iVar3 == '\0') {
                                pUVar8 = (UnicodeSet *)0x400;
                                addCategory((UnicodeSet *)local_3dc._4_8_,0x3e,
                                            (UErrorCode *)local_3dc);
                              }
                              else {
                                local_3b8.p_ = L"javaUnicodeIdentifierPart";
                                iVar3 = UnicodeString::compare(propName,&local_3b8,-1);
                                local_280 = local_3b8.p_;
                                if (iVar3 == '\0') {
                                  addCategory((UnicodeSet *)local_3dc._4_8_,0x3e,
                                              (UErrorCode *)local_3dc);
                                  addCategory((UnicodeSet *)local_3dc._4_8_,0x400000,
                                              (UErrorCode *)local_3dc);
                                  addCategory((UnicodeSet *)local_3dc._4_8_,0x200,
                                              (UErrorCode *)local_3dc);
                                  addCategory((UnicodeSet *)local_3dc._4_8_,0x400,
                                              (UErrorCode *)local_3dc);
                                  addCategory((UnicodeSet *)local_3dc._4_8_,0x100,
                                              (UErrorCode *)local_3dc);
                                  addCategory((UnicodeSet *)local_3dc._4_8_,0x40,
                                              (UErrorCode *)local_3dc);
                                  goto LAB_0016e6e4;
                                }
                                local_3c0.p_ = L"javaUpperCase";
                                iVar3 = UnicodeString::compare(propName,&local_3c0,-1);
                                local_290 = local_3c0.p_;
                                if (iVar3 != '\0') {
                                  local_3c8._vptr_UnicodeMatcher = (_func_int **)0x1d9c0a;
                                  iVar3 = UnicodeString::compare
                                                    (propName,(ConstChar16Ptr *)&local_3c8,-1);
                                  local_2a0 = local_3c8._vptr_UnicodeMatcher;
                                  if (iVar3 != '\0') {
                                    pUVar8 = (UnicodeSet *)(local_3dc + 0xc);
                                    local_3dc._12_8_ = L"javaWhitespace";
                                    iVar3 = UnicodeString::compare
                                                      (propName,(ConstChar16Ptr *)pUVar8,-1);
                                    local_2b0 = (char16_t *)local_3dc._12_8_;
                                    if (iVar3 == '\0') {
                                      addCategory((UnicodeSet *)local_3dc._4_8_,0x7000,
                                                  (UErrorCode *)local_3dc);
                                      uVar2 = local_3dc._4_8_;
                                      UnicodeSet::UnicodeSet(&local_c8);
                                      pUVar8 = UnicodeSet::add(&local_c8,0xa0);
                                      pUVar8 = UnicodeSet::add(pUVar8,0x2007);
                                      pUVar8 = UnicodeSet::add(pUVar8,0x202f);
                                      UnicodeSet::removeAll((UnicodeSet *)uVar2,pUVar8);
                                      UnicodeSet::~UnicodeSet(&local_c8);
                                      pUVar9 = UnicodeSet::add((UnicodeSet *)local_3dc._4_8_,9,0xd);
                                      end = 0x1f;
                                      pUVar8 = (UnicodeSet *)0x1c;
                                      goto LAB_0016e64e;
                                    }
                                    local_3dc._0_4_ = U_REGEX_PROPERTY_SYNTAX;
                                    goto LAB_0016e86a;
                                  }
                                  pUVar8 = (UnicodeSet *)0x0;
                                  goto LAB_0016e7a1;
                                }
                                pUVar8 = (UnicodeSet *)0x2;
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                  goto LAB_0016e858;
                }
                addCategory((UnicodeSet *)local_3dc._4_8_,0x3e,(UErrorCode *)local_3dc);
                addCategory((UnicodeSet *)local_3dc._4_8_,0x2000000,(UErrorCode *)local_3dc);
                addCategory((UnicodeSet *)local_3dc._4_8_,0x400000,(UErrorCode *)local_3dc);
                addCategory((UnicodeSet *)local_3dc._4_8_,0x200,(UErrorCode *)local_3dc);
                addCategory((UnicodeSet *)local_3dc._4_8_,0x400,(UErrorCode *)local_3dc);
                addCategory((UnicodeSet *)local_3dc._4_8_,0x100,(UErrorCode *)local_3dc);
                addCategory((UnicodeSet *)local_3dc._4_8_,0x40,(UErrorCode *)local_3dc);
              }
LAB_0016e6e4:
              pUVar8 = (UnicodeSet *)local_3dc;
              addIdentifierIgnorable((UnicodeSet *)local_3dc._4_8_,(UErrorCode *)pUVar8);
            }
LAB_0016e86a:
            if (((int)local_3dc._0_4_ < U_ILLEGAL_ARGUMENT_ERROR) &&
               (UVar4 = UnicodeSet::isEmpty((UnicodeSet *)local_3dc._4_8_),
               UVar4 == '\0' && options != 0)) {
              pUVar8 = (UnicodeSet *)0x2;
              UnicodeSet::closeOver((UnicodeSet *)local_3dc._4_8_,2);
            }
            goto LAB_0016e899;
          }
        }
        local_3dc._0_4_ = U_REGEX_PROPERTY_SYNTAX;
      }
LAB_0016e899:
      UnicodeString::~UnicodeString(&local_330);
      goto LAB_0016e8a6;
    }
    pUVar8 = (UnicodeSet *)UMemory::operator_new((UMemory *)0x58,sVar11);
    if (pUVar8 == (UnicodeSet *)0x0) goto LAB_0016deab;
    UnicodeSet::UnicodeSet(pUVar8,0,0x10ffff);
  }
  LocalPointer<icu_63::UnicodeSet>::adoptInsteadAndCheckErrorCode
            ((LocalPointer<icu_63::UnicodeSet> *)(local_3dc + 4),pUVar8,(UErrorCode *)local_3dc);
LAB_0016e8a6:
  UnicodeString::~UnicodeString(&local_108);
  if ((int)local_3dc._0_4_ < U_ILLEGAL_ARGUMENT_ERROR) {
    if (negated != '\0') {
      UnicodeSet::complement((UnicodeSet *)local_3dc._4_8_);
    }
    pUVar9 = (UnicodeSet *)local_3dc._4_8_;
    local_3dc._4_8_ = (UnicodeSet *)0x0;
  }
  else {
    if (local_3dc._0_4_ == U_ILLEGAL_ARGUMENT_ERROR) {
      local_3dc._0_4_ = U_REGEX_PROPERTY_SYNTAX;
    }
    pUVar8 = (UnicodeSet *)(ulong)(uint)local_3dc._0_4_;
    error(this,local_3dc._0_4_);
    pUVar9 = (UnicodeSet *)0x0;
  }
  uVar2 = local_3dc._4_8_;
  if ((UnicodeSet *)local_3dc._4_8_ != (UnicodeSet *)0x0) {
    UnicodeSet::~UnicodeSet((UnicodeSet *)local_3dc._4_8_);
    UMemory::operator_delete((UMemory *)uVar2,pUVar8);
  }
  return pUVar9;
}

Assistant:

UnicodeSet *RegexCompile::createSetForProperty(const UnicodeString &propName, UBool negated) {

    if (U_FAILURE(*fStatus)) {
        return nullptr;
    }
    LocalPointer<UnicodeSet> set;
    UErrorCode status = U_ZERO_ERROR;

    do {      // non-loop, exists to allow breaks from the block.
        //
        //  First try the property as we received it
        //
        UnicodeString   setExpr;
        uint32_t        usetFlags = 0;
        setExpr.append(u"[\\p{", -1);
        setExpr.append(propName);
        setExpr.append(u"}]", -1);
        if (fModeFlags & UREGEX_CASE_INSENSITIVE) {
            usetFlags |= USET_CASE_INSENSITIVE;
        }
        set.adoptInsteadAndCheckErrorCode(new UnicodeSet(setExpr, usetFlags, NULL, status), status);
        if (U_SUCCESS(status) || status == U_MEMORY_ALLOCATION_ERROR) {
            break;
        }

        //
        //  The incoming property wasn't directly recognized by ICU.

        //  Check [:word:] and [:all:]. These are not recognized as a properties by ICU UnicodeSet.
        //     Java accepts 'word' with mixed case.
        //     Java accepts 'all' only in all lower case.

        status = U_ZERO_ERROR;
        if (propName.caseCompare(u"word", -1, 0) == 0) {
            set.adoptInsteadAndCheckErrorCode(new UnicodeSet(*(fRXPat->fStaticSets[URX_ISWORD_SET])), status);
            break;
        }
        if (propName.compare(u"all", -1) == 0) {
            set.adoptInsteadAndCheckErrorCode(new UnicodeSet(0, 0x10ffff), status);
            break;
        }


        //    Do Java InBlock expressions
        //
        UnicodeString mPropName = propName;
        if (mPropName.startsWith(u"In", 2) && mPropName.length() >= 3) {
            status = U_ZERO_ERROR;
            set.adoptInsteadAndCheckErrorCode(new UnicodeSet(), status);
            if (U_FAILURE(status)) {
                break;
            }
            UnicodeString blockName(mPropName, 2);  // Property with the leading "In" removed.
            set->applyPropertyAlias(UnicodeString(u"Block"), blockName, status);
            break;
        }

        //  Check for the Java form "IsBooleanPropertyValue", which we will recast
        //  as "BooleanPropertyValue". The property value can be either a
        //  a General Category or a Script Name.

        if (propName.startsWith(u"Is", 2) && propName.length()>=3) {
            mPropName.remove(0, 2);      // Strip the "Is"
            if (mPropName.indexOf(u'=') >= 0) {
                // Reject any "Is..." property expression containing an '=', that is,
                // any non-binary property expression.
                status = U_REGEX_PROPERTY_SYNTAX;
                break;
            }

            if (mPropName.caseCompare(u"assigned", -1, 0) == 0) {
                mPropName.setTo(u"unassigned", -1);
                negated = !negated;
            } else if (mPropName.caseCompare(u"TitleCase", -1, 0) == 0) {
                mPropName.setTo(u"Titlecase_Letter", -1);
            }

            mPropName.insert(0, u"[\\p{", -1);
            mPropName.append(u"}]", -1);
            set.adoptInsteadAndCheckErrorCode(new UnicodeSet(mPropName, *fStatus), status);

            if (U_SUCCESS(status) && !set->isEmpty() && (usetFlags & USET_CASE_INSENSITIVE)) {
                set->closeOver(USET_CASE_INSENSITIVE);
            }
            break;

        }

        if (propName.startsWith(u"java", -1)) {
            status = U_ZERO_ERROR;
            set.adoptInsteadAndCheckErrorCode(new UnicodeSet(), status);
            if (U_FAILURE(status)) {
                break;
            }
            //
            //  Try the various Java specific properties.
            //   These all begin with "java"
            //
            if (propName.compare(u"javaDefined", -1) == 0) {
                addCategory(set.getAlias(), U_GC_CN_MASK, status);
                set->complement();
            }
            else if (propName.compare(u"javaDigit", -1) == 0) {
                addCategory(set.getAlias(), U_GC_ND_MASK, status);
            }
            else if (propName.compare(u"javaIdentifierIgnorable", -1) == 0) {
                addIdentifierIgnorable(set.getAlias(), status);
            }
            else if (propName.compare(u"javaISOControl", -1) == 0) {
                set->add(0, 0x1F).add(0x7F, 0x9F);
            }
            else if (propName.compare(u"javaJavaIdentifierPart", -1) == 0) {
                addCategory(set.getAlias(), U_GC_L_MASK, status);
                addCategory(set.getAlias(), U_GC_SC_MASK, status);
                addCategory(set.getAlias(), U_GC_PC_MASK, status);
                addCategory(set.getAlias(), U_GC_ND_MASK, status);
                addCategory(set.getAlias(), U_GC_NL_MASK, status);
                addCategory(set.getAlias(), U_GC_MC_MASK, status);
                addCategory(set.getAlias(), U_GC_MN_MASK, status);
                addIdentifierIgnorable(set.getAlias(), status);
            }
            else if (propName.compare(u"javaJavaIdentifierStart", -1) == 0) {
                addCategory(set.getAlias(), U_GC_L_MASK, status);
                addCategory(set.getAlias(), U_GC_NL_MASK, status);
                addCategory(set.getAlias(), U_GC_SC_MASK, status);
                addCategory(set.getAlias(), U_GC_PC_MASK, status);
            }
            else if (propName.compare(u"javaLetter", -1) == 0) {
                addCategory(set.getAlias(), U_GC_L_MASK, status);
            }
            else if (propName.compare(u"javaLetterOrDigit", -1) == 0) {
                addCategory(set.getAlias(), U_GC_L_MASK, status);
                addCategory(set.getAlias(), U_GC_ND_MASK, status);
            }
            else if (propName.compare(u"javaLowerCase", -1) == 0) {
                addCategory(set.getAlias(), U_GC_LL_MASK, status);
            }
            else if (propName.compare(u"javaMirrored", -1) == 0) {
                set->applyIntPropertyValue(UCHAR_BIDI_MIRRORED, 1, status);
            }
            else if (propName.compare(u"javaSpaceChar", -1) == 0) {
                addCategory(set.getAlias(), U_GC_Z_MASK, status);
            }
            else if (propName.compare(u"javaSupplementaryCodePoint", -1) == 0) {
                set->add(0x10000, UnicodeSet::MAX_VALUE);
            }
            else if (propName.compare(u"javaTitleCase", -1) == 0) {
                addCategory(set.getAlias(), U_GC_LT_MASK, status);
            }
            else if (propName.compare(u"javaUnicodeIdentifierStart", -1) == 0) {
                addCategory(set.getAlias(), U_GC_L_MASK, status);
                addCategory(set.getAlias(), U_GC_NL_MASK, status);
            }
            else if (propName.compare(u"javaUnicodeIdentifierPart", -1) == 0) {
                addCategory(set.getAlias(), U_GC_L_MASK, status);
                addCategory(set.getAlias(), U_GC_PC_MASK, status);
                addCategory(set.getAlias(), U_GC_ND_MASK, status);
                addCategory(set.getAlias(), U_GC_NL_MASK, status);
                addCategory(set.getAlias(), U_GC_MC_MASK, status);
                addCategory(set.getAlias(), U_GC_MN_MASK, status);
                addIdentifierIgnorable(set.getAlias(), status);
            }
            else if (propName.compare(u"javaUpperCase", -1) == 0) {
                addCategory(set.getAlias(), U_GC_LU_MASK, status);
            }
            else if (propName.compare(u"javaValidCodePoint", -1) == 0) {
                set->add(0, UnicodeSet::MAX_VALUE);
            }
            else if (propName.compare(u"javaWhitespace", -1) == 0) {
                addCategory(set.getAlias(), U_GC_Z_MASK, status);
                set->removeAll(UnicodeSet().add(0xa0).add(0x2007).add(0x202f));
                set->add(9, 0x0d).add(0x1c, 0x1f);
            } else {
                status = U_REGEX_PROPERTY_SYNTAX;
            }

            if (U_SUCCESS(status) && !set->isEmpty() && (usetFlags & USET_CASE_INSENSITIVE)) {
                set->closeOver(USET_CASE_INSENSITIVE);
            }
            break;
        }

        // Unrecognized property. ICU didn't like it as it was, and none of the Java compatibility
        // extensions matched it.
        status = U_REGEX_PROPERTY_SYNTAX;
    } while (false);   // End of do loop block. Code above breaks out of the block on success or hard failure.

    if (U_SUCCESS(status)) {
        U_ASSERT(set.isValid());
        if (negated) {
            set->complement();
        }
        return set.orphan();
    } else {
        if (status == U_ILLEGAL_ARGUMENT_ERROR) {
            status = U_REGEX_PROPERTY_SYNTAX;
        }
        error(status);
        return nullptr;
    }
}